

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O3

void gmlc::networking::insertProtocol(string *networkAddress,InterfaceTypes interfaceT)

{
  size_type sVar1;
  char *__s;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (networkAddress,"://",0,3);
  if (sVar1 != 0xffffffffffffffff) {
switchD_004268c3_default:
    return;
  }
  switch(interfaceT) {
  case TCP:
  case IP:
    __s = "tcp://";
    break;
  case UDP:
    __s = "udp://";
    break;
  case IPC:
    __s = "ipc://";
    break;
  case INPROC:
    __s = "inproc://";
    sVar1 = 9;
    goto LAB_004268f3;
  default:
    goto switchD_004268c3_default;
  }
  sVar1 = 6;
LAB_004268f3:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
            (networkAddress,0,0,__s,sVar1);
  return;
}

Assistant:

void insertProtocol(std::string& networkAddress, InterfaceTypes interfaceT)
{
    if (networkAddress.find("://") == std::string::npos) {
        switch (interfaceT) {
            case InterfaceTypes::IP:
            case InterfaceTypes::TCP:
                networkAddress.insert(0, "tcp://");
                break;
            case InterfaceTypes::IPC:
                networkAddress.insert(0, "ipc://");
                break;
            case InterfaceTypes::UDP:
                networkAddress.insert(0, "udp://");
                break;
            case InterfaceTypes::INPROC:
                networkAddress.insert(0, "inproc://");
                break;
        }
    }
}